

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-open.c
# Opt level: O0

void write1_cb(uv_write_t *req,int status)

{
  int iVar1;
  undefined1 auVar2 [16];
  int64_t eval_b_1;
  int64_t eval_a_1;
  void *eval_b;
  void *eval_a;
  undefined8 uStack_30;
  int r;
  uv_buf_t buf;
  int status_local;
  uv_write_t *req_local;
  
  buf.len._4_4_ = status;
  if (req == (uv_write_t *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-open.c"
            ,0x9e,"req","!=","NULL",0,"!=",0);
    abort();
  }
  if (status == 0) {
    if (shutdown_requested == 0) {
      auVar2 = uv_buf_init("P",1);
      buf.base = auVar2._8_8_;
      uStack_30 = auVar2._0_8_;
      iVar1 = uv_write(&write_req,req->handle,&stack0xffffffffffffffd0,1,write1_cb);
      if ((long)iVar1 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-open.c"
                ,0xa9,"r","==","0",(long)iVar1,"==",0);
        abort();
      }
      write_cb_called = write_cb_called + 1;
    }
  }
  else if (shutdown_cb_called == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-open.c"
            ,0xa0,"shutdown_cb_called");
    abort();
  }
  return;
}

Assistant:

static void write1_cb(uv_write_t* req, int status) {
  uv_buf_t buf;
  int r;

  ASSERT_NOT_NULL(req);
  if (status) {
    ASSERT(shutdown_cb_called);
    return;
  }

  if (shutdown_requested)
    return;

  buf = uv_buf_init("P", 1);
  r = uv_write(&write_req, req->handle, &buf, 1, write1_cb);
  ASSERT_OK(r);

  write_cb_called++;
}